

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall PlanTestDoubleDependent::Run(PlanTestDoubleDependent *this)

{
  Plan *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  Edge *pEVar5;
  allocator<char> local_61;
  string err;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat a1 a2\nbuild a1: cat mid\nbuild a2: cat mid\nbuild mid: cat in\n",
              (ManifestParserOptions)0x0);
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"mid",(allocator<char> *)&local_40);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&err);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"a1",(allocator<char> *)&local_40);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&err);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"a2",(allocator<char> *)&local_40);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&err);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"out",(allocator<char> *)&local_40);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&err);
  pNVar4->dirty_ = true;
  std::__cxx11::string::~string((string *)&err);
  pTVar2 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out",&local_61);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_40);
  this_00 = &(this->super_PlanTest).plan_;
  bVar3 = Plan::AddTarget(this_00,pNVar4,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
             ,0xab,"plan_.AddTarget(GetNode(\"out\"), &err)");
  std::__cxx11::string::~string((string *)&local_40);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0xac,"\"\" == err");
  if ((bVar3) &&
     (bVar3 = testing::Test::Check
                        (g_current_test,
                         0 < (this->super_PlanTest).plan_.command_edges_ &&
                         0 < (this->super_PlanTest).plan_.wanted_edges_,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0xad,"plan_.more_to_do()"), bVar3)) {
    pEVar5 = Plan::FindWork(this_00);
    bVar3 = testing::Test::Check
                      (g_current_test,pEVar5 != (Edge *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0xb1,"edge");
    if (bVar3) {
      Plan::EdgeFinished(this_00,pEVar5,kEdgeSucceeded,&err);
      pTVar2 = g_current_test;
      bVar3 = std::operator==("",&err);
      bVar3 = testing::Test::Check
                        (pTVar2,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0xb3,"\"\" == err");
      if (bVar3) {
        pEVar5 = Plan::FindWork(this_00);
        bVar3 = testing::Test::Check
                          (g_current_test,pEVar5 != (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xb6,"edge");
        if (bVar3) {
          Plan::EdgeFinished(this_00,pEVar5,kEdgeSucceeded,&err);
          pTVar2 = g_current_test;
          bVar3 = std::operator==("",&err);
          bVar3 = testing::Test::Check
                            (pTVar2,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0xb8,"\"\" == err");
          if (bVar3) {
            pEVar5 = Plan::FindWork(this_00);
            bVar3 = testing::Test::Check
                              (g_current_test,pEVar5 != (Edge *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0xbb,"edge");
            if (bVar3) {
              Plan::EdgeFinished(this_00,pEVar5,kEdgeSucceeded,&err);
              pTVar2 = g_current_test;
              bVar3 = std::operator==("",&err);
              bVar3 = testing::Test::Check
                                (pTVar2,bVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                 ,0xbd,"\"\" == err");
              if (bVar3) {
                pEVar5 = Plan::FindWork(this_00);
                bVar3 = testing::Test::Check
                                  (g_current_test,pEVar5 != (Edge *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                   ,0xc0,"edge");
                if (bVar3) {
                  Plan::EdgeFinished(this_00,pEVar5,kEdgeSucceeded,&err);
                  pTVar2 = g_current_test;
                  bVar3 = std::operator==("",&err);
                  bVar3 = testing::Test::Check
                                    (pTVar2,bVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                     ,0xc2,"\"\" == err");
                  if (bVar3) {
                    pEVar5 = Plan::FindWork(this_00);
                    bVar3 = testing::Test::Check
                                      (g_current_test,pEVar5 == (Edge *)0x0,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                       ,0xc5,"edge");
                    if (bVar3) goto LAB_0011e866;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0011e866:
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(PlanTest, DoubleDependent) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat a1 a2\n"
"build a1: cat mid\n"
"build a2: cat mid\n"
"build mid: cat in\n"));
  GetNode("mid")->MarkDirty();
  GetNode("a1")->MarkDirty();
  GetNode("a2")->MarkDirty();
  GetNode("out")->MarkDirty();

  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("out"), &err));
  ASSERT_EQ("", err);
  ASSERT_TRUE(plan_.more_to_do());

  Edge* edge;
  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat in
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat mid
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat mid
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);  // cat a1 a2
  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_FALSE(edge);  // done
}